

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGValidateCompiledCallback
               (xmlRegExecCtxtPtr exec,xmlChar *token,void *transdata,void *inputdata)

{
  int iVar1;
  xmlRelaxNGValidCtxtPtr ctxt;
  xmlRelaxNGDefinePtr_conflict define;
  
  if (inputdata != (void *)0x0) {
    if (transdata == (void *)0x0) {
      if (*token != '#') {
        xmlRelaxNGValidateCompiledCallback_cold_2();
      }
    }
    else if (*transdata == 4) {
      iVar1 = xmlRelaxNGValidateDefinition
                        ((xmlRelaxNGValidCtxtPtr)inputdata,(xmlRelaxNGDefinePtr_conflict)transdata);
      if (iVar1 != 0) {
        *(int *)((long)inputdata + 0xb8) = iVar1;
      }
    }
    else {
      xmlRelaxNGValidateCompiledCallback_cold_1();
    }
    return;
  }
  fprintf(_stderr,"callback on %s missing context\n",token);
  return;
}

Assistant:

static void
xmlRelaxNGValidateCompiledCallback(xmlRegExecCtxtPtr exec ATTRIBUTE_UNUSED,
                                   const xmlChar * token,
                                   void *transdata, void *inputdata)
{
    xmlRelaxNGValidCtxtPtr ctxt = (xmlRelaxNGValidCtxtPtr) inputdata;
    xmlRelaxNGDefinePtr define = (xmlRelaxNGDefinePtr) transdata;
    int ret;

#ifdef DEBUG_COMPILE
    xmlGenericError(xmlGenericErrorContext,
                    "Compiled callback for: '%s'\n", token);
#endif
    if (ctxt == NULL) {
        fprintf(stderr, "callback on %s missing context\n", token);
        return;
    }
    if (define == NULL) {
        if (token[0] == '#')
            return;
        fprintf(stderr, "callback on %s missing define\n", token);
        if ((ctxt != NULL) && (ctxt->errNo == XML_RELAXNG_OK))
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    }
    if ((ctxt == NULL) || (define == NULL)) {
        fprintf(stderr, "callback on %s missing info\n", token);
        if ((ctxt != NULL) && (ctxt->errNo == XML_RELAXNG_OK))
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    } else if (define->type != XML_RELAXNG_ELEMENT) {
        fprintf(stderr, "callback on %s define is not element\n", token);
        if (ctxt->errNo == XML_RELAXNG_OK)
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    }
    ret = xmlRelaxNGValidateDefinition(ctxt, define);
    if (ret != 0)
        ctxt->perr = ret;
}